

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue async_func_resume(JSContext *ctx,JSAsyncFunctionState *s)

{
  JSValue new_target;
  JSValue func_obj_00;
  BOOL BVar1;
  JSValue *in_RSI;
  JSContext *in_RDI;
  JSValue func_obj;
  size_t in_stack_ffffffffffffff88;
  JSRuntime *in_stack_ffffffffffffff90;
  uint uStack_4c;
  JSValue local_10;
  
  BVar1 = js_check_stack_overflow(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (BVar1 == 0) {
    func_obj_00.tag = 0;
    func_obj_00.u.ptr = in_RSI;
    new_target.tag = 3;
    new_target.u.ptr = (void *)((ulong)uStack_4c << 0x20);
    local_10 = JS_CallInternal(in_RDI,func_obj_00,*in_RSI,new_target,in_RSI[1].u.int32,
                               (JSValue *)in_RSI[3].u.ptr,4);
  }
  else {
    local_10 = JS_ThrowStackOverflow((JSContext *)0x16900f);
  }
  return local_10;
}

Assistant:

static JSValue async_func_resume(JSContext *ctx, JSAsyncFunctionState *s)
{
    JSValue func_obj;

    if (js_check_stack_overflow(ctx->rt, 0))
        return JS_ThrowStackOverflow(ctx);

    /* the tag does not matter provided it is not an object */
    func_obj = JS_MKPTR(JS_TAG_INT, s);
    return JS_CallInternal(ctx, func_obj, s->this_val, JS_UNDEFINED,
                           s->argc, s->frame.arg_buf, JS_CALL_FLAG_GENERATOR);
}